

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O0

_compilation_result __thiscall
glcts::TessellationShaderError1InputBlocks::getCompilationResult
          (TessellationShaderError1InputBlocks *this,_pipeline_stage pipeline_stage)

{
  _pipeline_stage pipeline_stage_local;
  TessellationShaderError1InputBlocks *this_local;
  
  if (pipeline_stage == PIPELINE_STAGE_TESSELLATION_CONTROL) {
    this_local._4_4_ = COMPILATION_RESULT_CAN_FAIL;
  }
  else if (pipeline_stage == PIPELINE_STAGE_VERTEX) {
    this_local._4_4_ = COMPILATION_RESULT_CAN_FAIL;
  }
  else {
    this_local._4_4_ = COMPILATION_RESULT_MUST_SUCCEED;
  }
  return this_local._4_4_;
}

Assistant:

TessellationShaderErrorsTestCaseBase::_compilation_result TessellationShaderError1InputBlocks::getCompilationResult(
	_pipeline_stage pipeline_stage)
{
	/* Tessellation control shader is allowed to fail to compile,
	 * shaders for all other stages should compile successfully
	 *
	 * NOTE: Vertex shader compilation can fail if underlying implementation does not support
	 *       GL_EXT_shader_io_blocks.
	 **/
	switch (pipeline_stage)
	{
	case PIPELINE_STAGE_VERTEX:
		return COMPILATION_RESULT_CAN_FAIL;
	case PIPELINE_STAGE_TESSELLATION_CONTROL:
		return COMPILATION_RESULT_CAN_FAIL;
	default:
		return COMPILATION_RESULT_MUST_SUCCEED;
	}
}